

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

void __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::GenericDocument(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  *this,GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                        *rhs)

{
  Ch *pCVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *pMVar2;
  CrtAllocator *pCVar3;
  char *pcVar4;
  size_t sVar5;
  undefined4 uVar6;
  
  pCVar1 = (rhs->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.s.str;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.n = (rhs->
              super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ).data_.n;
  (this->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.s.str = pCVar1;
  (rhs->
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  ).data_.f.flags = 0;
  pMVar2 = rhs->ownAllocator_;
  this->allocator_ = rhs->allocator_;
  this->ownAllocator_ = pMVar2;
  pCVar3 = (rhs->stack_).ownAllocator_;
  (this->stack_).allocator_ = (rhs->stack_).allocator_;
  (this->stack_).ownAllocator_ = pCVar3;
  pcVar4 = (rhs->stack_).stackTop_;
  (this->stack_).stack_ = (rhs->stack_).stack_;
  (this->stack_).stackTop_ = pcVar4;
  (this->stack_).stackEnd_ = (rhs->stack_).stackEnd_;
  (this->stack_).initialCapacity_ = (rhs->stack_).initialCapacity_;
  (rhs->stack_).stackEnd_ = (char *)0x0;
  (rhs->stack_).initialCapacity_ = 0;
  (rhs->stack_).stack_ = (char *)0x0;
  (rhs->stack_).stackTop_ = (char *)0x0;
  (rhs->stack_).allocator_ = (CrtAllocator *)0x0;
  (rhs->stack_).ownAllocator_ = (CrtAllocator *)0x0;
  uVar6 = *(undefined4 *)&(rhs->parseResult_).field_0x4;
  sVar5 = (rhs->parseResult_).offset_;
  (this->parseResult_).code_ = (rhs->parseResult_).code_;
  *(undefined4 *)&(this->parseResult_).field_0x4 = uVar6;
  (this->parseResult_).offset_ = sVar5;
  (rhs->parseResult_).code_ = kParseErrorNone;
  (rhs->parseResult_).offset_ = 0;
  rhs->allocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  rhs->ownAllocator_ = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  return;
}

Assistant:

GenericValue(GenericValue&& rhs) RAPIDJSON_NOEXCEPT : data_(rhs.data_) {
        rhs.data_.f.flags = kNullFlag; // give up contents
    }